

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

Gia_Man_t * Gia_ManUpdateExtraAig2(void *pTime,Gia_Man_t *p,Vec_Int_t *vBoxesLeft)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Gia_Man_t *pGVar7;
  long lVar8;
  
  iVar2 = Tim_ManPiNum((Tim_Man_t *)pTime);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  iVar1 = vBoxesLeft->nSize;
  iVar3 = Tim_ManBoxNum((Tim_Man_t *)pTime);
  if (iVar3 < iVar1) {
    __assert_fail("Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(pManTime)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x2d0,"Gia_Man_t *Gia_ManUpdateExtraAig2(void *, Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = p->vCos->nSize;
  iVar3 = Tim_ManCiNum((Tim_Man_t *)pTime);
  if (iVar1 == iVar3 - iVar2) {
    if (0 < vBoxesLeft->nSize) {
      lVar8 = 0;
      do {
        iVar1 = vBoxesLeft->pArray[lVar8];
        iVar3 = Tim_ManBoxOutputFirst((Tim_Man_t *)pTime,iVar1);
        iVar4 = Tim_ManBoxOutputNum((Tim_Man_t *)pTime,iVar1);
        if (0 < iVar4) {
          iVar4 = 0;
          do {
            Vec_IntPush(p_00,(iVar3 - iVar2) + iVar4);
            iVar4 = iVar4 + 1;
            iVar5 = Tim_ManBoxOutputNum((Tim_Man_t *)pTime,iVar1);
          } while (iVar4 < iVar5);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vBoxesLeft->nSize);
    }
    pGVar7 = Gia_ManDupSelectedOutputs(p,p_00);
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    return pGVar7;
  }
  __assert_fail("Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - nRealPis",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                ,0x2d1,"Gia_Man_t *Gia_ManUpdateExtraAig2(void *, Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManUpdateExtraAig2( void * pTime, Gia_Man_t * p, Vec_Int_t * vBoxesLeft )
{
    Gia_Man_t * pNew;
    Tim_Man_t * pManTime = (Tim_Man_t *)pTime;
    int nRealPis = Tim_ManPiNum(pManTime);
    Vec_Int_t * vOutsLeft = Vec_IntAlloc( 100 );
    int i, k, iBox, iOutFirst;
    assert( Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(pManTime) );
    assert( Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - nRealPis );
    Vec_IntForEachEntry( vBoxesLeft, iBox, i )
    {
        iOutFirst = Tim_ManBoxOutputFirst(pManTime, iBox) - nRealPis;
        for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, iBox); k++ )
            Vec_IntPush( vOutsLeft, iOutFirst + k );
    }
    pNew = Gia_ManDupSelectedOutputs( p, vOutsLeft );
    Vec_IntFree( vOutsLeft );
    return pNew;
}